

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SVInt.cpp
# Opt level: O2

bool slang::literalBaseFromChar(char base,LiteralBase *result)

{
  LiteralBase LVar1;
  undefined3 in_register_00000039;
  int iVar2;
  
  iVar2 = CONCAT31(in_register_00000039,base);
  if (iVar2 == 0x42) {
LAB_00203022:
    LVar1 = Binary;
  }
  else {
    LVar1 = Decimal;
    if (iVar2 == 0x44) goto LAB_0020302c;
    if (iVar2 != 0x48) {
      if ((iVar2 == 0x4f) || (iVar2 == 0x6f)) {
        LVar1 = Octal;
        goto LAB_0020302c;
      }
      if (iVar2 == 100) goto LAB_0020302c;
      if (iVar2 != 0x68) {
        if (iVar2 != 0x62) {
          return false;
        }
        goto LAB_00203022;
      }
    }
    LVar1 = Hex;
  }
LAB_0020302c:
  *result = LVar1;
  return true;
}

Assistant:

bool literalBaseFromChar(char base, LiteralBase& result) {
    switch (base) {
        case 'd':
        case 'D':
            result = LiteralBase::Decimal;
            return true;
        case 'b':
        case 'B':
            result = LiteralBase::Binary;
            return true;
        case 'o':
        case 'O':
            result = LiteralBase::Octal;
            return true;
        case 'h':
        case 'H':
            result = LiteralBase::Hex;
            return true;
        default:
            return false;
    }
}